

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Oric.cpp
# Opt level: O2

bool __thiscall
Oric::ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)4,_(CPU::MOS6502Esque::Type)5>
::insert_media(ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)4,_(CPU::MOS6502Esque::Type)5>
               *this,Media *media)

{
  __shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2> *p_Var1;
  __shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  __shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  p_Var1 = &((media->tapes).
             super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
            super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>;
  p_Var2 = &((media->tapes).
             super__Vector_base<std::shared_ptr<Storage::Tape::Tape>,_std::allocator<std::shared_ptr<Storage::Tape::Tape>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>;
  bVar3 = p_Var1 != p_Var2;
  if (bVar3) {
    std::__shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,p_Var1);
    Storage::Tape::TapePlayer::set_tape
              ((TapePlayer *)&this->tape_player_,(shared_ptr<Storage::Tape::Tape> *)&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  }
  if ((media->disks).
      super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (media->disks).
      super__Vector_base<std::shared_ptr<Storage::Disk::Disk>,_std::allocator<std::shared_ptr<Storage::Disk::Disk>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    bVar3 = insert_disks<Oric::BD500>(this,media,&this->bd500_,4);
    bVar3 = bVar3 || p_Var1 != p_Var2;
  }
  return bVar3;
}

Assistant:

bool insert_media(const Analyser::Static::Media &media) final {
			bool inserted = false;

			if(!media.tapes.empty()) {
				tape_player_.set_tape(media.tapes.front());
				inserted = true;
			}

			if(!media.disks.empty()) {
				switch(disk_interface) {
					case DiskInterface::BD500:		inserted |= insert_disks(media, bd500_, 4);		break;
					case DiskInterface::Jasmin:		inserted |= insert_disks(media, jasmin_, 4);	break;
					case DiskInterface::Microdisc:	inserted |= insert_disks(media, microdisc_, 4);	break;
					case DiskInterface::Pravetz:	inserted |= insert_disks(media, *diskii_.last_valid(), 2);	break;
					default: break;
				}
			}

			return inserted;
		}